

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::CloudMediumProvider::Density(CloudMediumProvider *this,Point3f p,SampledWavelengths *param_2)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  CloudMediumProvider *this_00;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [64];
  float fVar10;
  undefined1 auVar11 [16];
  Point3f p_00;
  Point3f p_01;
  float local_70;
  float local_6c;
  float local_58;
  float fStack_54;
  SampledSpectrum local_20;
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  Vector3f VVar12;
  
  auVar8._8_56_ = p._8_56_;
  auVar8._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_70 = this->frequency;
  local_58 = local_70 * p.super_Tuple3<pbrt::Point3,_float>.x;
  fStack_54 = local_70 * p.super_Tuple3<pbrt::Point3,_float>.y;
  local_70 = local_70 * p.super_Tuple3<pbrt::Point3,_float>.z;
  local_6c = 0.0;
  this_00 = this;
  if (0.0 < this->wispiness) {
    fVar10 = 10.0;
    iVar4 = 2;
    fVar7 = this->wispiness * 0.05;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar10 * local_58;
      p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar10 * fStack_54;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = local_70 * fVar10;
      VVar12 = DNoise(p_00);
      local_58 = local_58 + fVar7 * VVar12.super_Tuple3<pbrt::Vector3,_float>.x;
      fStack_54 = fStack_54 + fVar7 * VVar12.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar10 = fVar10 * 1.99;
      local_70 = local_70 + fVar7 * VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
      fVar7 = fVar7 * 0.5;
    }
  }
  fVar7 = 0.5;
  fVar10 = 1.0;
  iVar4 = 5;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    p_01.super_Tuple3<pbrt::Point3,_float>.x = fVar10 * local_58;
    p_01.super_Tuple3<pbrt::Point3,_float>.y = fVar10 * fStack_54;
    p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar10 * local_70;
    auVar9._0_4_ = Noise((pbrt *)this_00,p_01);
    auVar9._4_60_ = extraout_var;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)local_6c),auVar9._0_16_,ZEXT416((uint)fVar7));
    fVar7 = fVar7 * 0.5;
    local_6c = auVar3._0_4_;
    fVar10 = fVar10 * 1.99;
  }
  auVar1 = vmovshdup_avx(auVar8._0_16_);
  auVar11 = ZEXT816(0) << 0x40;
  auVar6 = ZEXT416((uint)((1.0 - auVar1._0_4_) * 4.5 * this->density * local_6c));
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar6);
  uVar2 = vcmpss_avx512f(auVar6,auVar11,1);
  auVar6._4_12_ = auVar3._4_12_;
  auVar6._0_4_ = (uint)!(bool)((byte)uVar2 & 1) * auVar3._0_4_;
  auVar3 = vmaxss_avx(ZEXT416((uint)(0.5 - auVar1._0_4_)),auVar11);
  auVar1 = vfmadd132ss_fma(auVar3,auVar6,ZEXT416(0x40000000));
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar1);
  uVar2 = vcmpss_avx512f(auVar1,auVar11,1);
  SampledSpectrum::SampledSpectrum(&local_20,(Float)((uint)!(bool)((byte)uVar2 & 1) * auVar3._0_4_))
  ;
  return (array<float,_4>)(array<float,_4>)local_20;
}

Assistant:

Density(Point3f p, const SampledWavelengths &) const {
        Point3f pp = frequency * p;
        if (wispiness > 0) {
            // Perturb cloud lookup point _pp_ using noise
            Float vomega = .05f * wispiness, vlambda = 10.f;
            for (int i = 0; i < 2; ++i) {
                pp += vomega * DNoise(vlambda * pp);
                vomega *= 0.5f;
                vlambda *= 1.99f;
            }
        }
        // Sum scales of noise to approximate cloud density
        Float d = 0;
        Float omega = .5, lambda = 1.f;
        for (int i = 0; i < 5; ++i) {
            d += omega * Noise(lambda * pp);
            omega *= 0.5f;
            lambda *= 1.99f;
        }

        // Model decrease in density with altitude and return final cloud density
        d = Clamp((1 - p.y) * 4.5f * density * d, 0, 1);
        d += 2 * std::max<Float>(0, .5f - p.y);
        return SampledSpectrum(Clamp(d, 0, 1));
    }